

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_widget_is_mouse_clicked(nk_context *ctx,nk_buttons btn)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_rect rect;
  long in_RDI;
  nk_rect bounds;
  nk_rect v;
  nk_rect c;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float fStack_40;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  nk_rect local_24 [2];
  nk_bool local_4;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(in_RDI + 0x40d0) != *(long *)(in_RDI + 0x40d8))) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8);
    uVar2 = *(undefined8 *)(lVar1 + 0x44);
    uVar3 = *(undefined8 *)(lVar1 + 0x4c);
    local_24[0].x = (float)uVar2;
    local_24[0].x = (float)(int)local_24[0].x;
    local_24[0].y = (float)((ulong)uVar2 >> 0x20);
    local_24[0].y = (float)(int)local_24[0].y;
    local_24[0].w = (float)uVar3;
    local_24[0].w = (float)(int)local_24[0].w;
    local_24[0].h = (float)((ulong)uVar3 >> 0x20);
    local_24[0].h = (float)(int)local_24[0].h;
    nk_layout_peek((nk_rect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (nk_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    nk_unify((nk_rect *)&stack0xffffffffffffffcc,local_24,in_stack_ffffffffffffffbc,fStack_40,
             in_stack_ffffffffffffffbc + in_stack_ffffffffffffffc4,
             fStack_40 + in_stack_ffffffffffffffc8);
    if (((local_24[0].x + local_24[0].w <= in_stack_ffffffffffffffbc) ||
        (in_stack_ffffffffffffffbc + in_stack_ffffffffffffffc4 <= local_24[0].x)) ||
       ((local_24[0].y + local_24[0].h <= fStack_40 ||
        (fStack_40 + in_stack_ffffffffffffffc8 <= local_24[0].y)))) {
      local_4 = 0;
    }
    else {
      rect.y = in_stack_ffffffffffffffc8;
      rect.x = in_stack_ffffffffffffffc4;
      rect.w = in_stack_ffffffffffffffcc;
      rect.h = in_stack_ffffffffffffffd0;
      local_4 = nk_input_mouse_clicked
                          ((nk_input *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           ,NK_BUTTON_LEFT,rect);
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_widget_is_mouse_clicked(struct nk_context *ctx, enum nk_buttons btn)
{
struct nk_rect c, v;
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current || ctx->active != ctx->current)
return 0;

c = ctx->current->layout->clip;
c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_layout_peek(&bounds, ctx);
nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
return 0;
return nk_input_mouse_clicked(&ctx->input, btn, bounds);
}